

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

bool libtorrent::aux::string_begins_no_case(char *s1,char *s2)

{
  char cVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  
  cVar1 = *s1;
  bVar5 = cVar1 == '\0';
  if (!bVar5) {
    cVar3 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar3 = cVar1;
    }
    cVar1 = *s2;
    cVar4 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar4 = cVar1;
    }
    if (cVar3 == cVar4) {
      lVar2 = 1;
      do {
        cVar1 = s1[lVar2];
        bVar5 = cVar1 == '\0';
        if (bVar5) {
          return bVar5;
        }
        cVar3 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar3 = cVar1;
        }
        cVar1 = s2[lVar2];
        cVar4 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar4 = cVar1;
        }
        lVar2 = lVar2 + 1;
      } while (cVar3 == cVar4);
    }
  }
  return bVar5;
}

Assistant:

bool string_begins_no_case(char const* s1, char const* s2)
	{
		TORRENT_ASSERT(s1 != nullptr);
		TORRENT_ASSERT(s2 != nullptr);

		while (*s1 != 0)
		{
			if (to_lower(*s1) != to_lower(*s2)) return false;
			++s1;
			++s2;
		}
		return true;
	}